

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

uint Kit_DsdGetSupports(Kit_DsdNtk_t *p)

{
  uint uVar1;
  uint *puVar2;
  Kit_DsdObj_t *pKVar3;
  Kit_DsdObj_t KVar4;
  
  if (p->pSupps != (uint *)0x0) {
    __assert_fail("p->pSupps == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                  ,0x6e7,"unsigned int Kit_DsdGetSupports(Kit_DsdNtk_t *)");
  }
  puVar2 = (uint *)malloc((ulong)p->nNodes << 2);
  p->pSupps = puVar2;
  pKVar3 = Kit_DsdNtkRoot(p);
  KVar4 = *pKVar3;
  if (((uint)KVar4 & 0x1c0) == 0x40) {
    if (p->nNodes != 1) {
      __assert_fail("p->nNodes == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                    ,0x6ed,"unsigned int Kit_DsdGetSupports(Kit_DsdNtk_t *)");
    }
    *p->pSupps = 0;
    KVar4 = *pKVar3;
  }
  if (((uint)KVar4 & 0x1c0) == 0x80) {
    if (p->nNodes != 1) {
      __assert_fail("p->nNodes == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                    ,0x6f2,"unsigned int Kit_DsdGetSupports(Kit_DsdNtk_t *)");
    }
    uVar1 = Kit_DsdLitSupport(p,(uint)*(ushort *)(pKVar3 + 1));
    *p->pSupps = uVar1;
  }
  else {
    uVar1 = Kit_DsdGetSupports_rec(p,(uint)p->Root);
  }
  if (uVar1 < 0x10000) {
    return uVar1;
  }
  __assert_fail("uSupport <= 0xFFFF",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                ,0x6f7,"unsigned int Kit_DsdGetSupports(Kit_DsdNtk_t *)");
}

Assistant:

unsigned Kit_DsdGetSupports( Kit_DsdNtk_t * p )
{
    Kit_DsdObj_t * pRoot;
    unsigned uSupport;
    assert( p->pSupps == NULL );
    p->pSupps = ABC_ALLOC( unsigned, p->nNodes );
    // consider simple special cases
    pRoot = Kit_DsdNtkRoot(p);
    if ( pRoot->Type == KIT_DSD_CONST1 )
    {
        assert( p->nNodes == 1 );
        uSupport = p->pSupps[0] = 0;
    }
    if ( pRoot->Type == KIT_DSD_VAR )
    {
        assert( p->nNodes == 1 );
        uSupport = p->pSupps[0] = Kit_DsdLitSupport( p, pRoot->pFans[0] );
    }
    else
        uSupport = Kit_DsdGetSupports_rec( p, p->Root );
    assert( uSupport <= 0xFFFF );
    return uSupport;
}